

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::MaybeIgnoreError(DBImpl *this,Status *s)

{
  Logger *info_log;
  char *pcVar1;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((s->state_ != (char *)0x0) && ((this->options_).paranoid_checks == false)) {
    info_log = (this->options_).info_log;
    Status::ToString_abi_cxx11_(&local_40,s);
    Log(info_log,"Ignoring error %s",local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = s->state_;
    s->state_ = (char *)0x0;
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::MaybeIgnoreError(Status* s) const {
  if (s->ok() || options_.paranoid_checks) {
    // No change needed
  } else {
    Log(options_.info_log, "Ignoring error %s", s->ToString().c_str());
    *s = Status::OK();
  }
}